

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O1

int4 __thiscall ActionExtraPopSetup::apply(ActionExtraPopSetup *this,Funcdata *data)

{
  int4 s;
  AddrSpace *pAVar1;
  FuncCallSpecs *pFVar2;
  int iVar3;
  undefined4 extraout_var;
  PcodeOp *op;
  Varnode *pVVar5;
  pointer ppFVar6;
  long lVar7;
  Address sb_addr;
  Address local_40;
  undefined8 *puVar4;
  
  pAVar1 = this->stackspace;
  if (pAVar1 != (AddrSpace *)0x0) {
    iVar3 = (*pAVar1->_vptr_AddrSpace[3])(pAVar1,0);
    puVar4 = (undefined8 *)CONCAT44(extraout_var,iVar3);
    local_40.base = (AddrSpace *)*puVar4;
    local_40.offset = puVar4[1];
    ppFVar6 = (data->qlst).super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(data->qlst).
                                super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar6) >> 3)) {
      s = *(int4 *)(puVar4 + 2);
      lVar7 = 0;
      do {
        pFVar2 = ppFVar6[lVar7];
        if ((pFVar2->super_FuncProto).extrapop != 0) {
          op = Funcdata::newOp(data,2,&(pFVar2->op->start).pc);
          Funcdata::newVarnodeOut(data,s,&local_40,op);
          pVVar5 = Funcdata::newVarnode(data,s,&local_40,(Datatype *)0x0);
          Funcdata::opSetInput(data,op,pVVar5,0);
          iVar3 = (pFVar2->super_FuncProto).extrapop;
          if (iVar3 == 0x8000) {
            Funcdata::opSetOpcode(data,op,CPUI_INDIRECT);
            pVVar5 = Funcdata::newVarnodeIop(data,pFVar2->op);
            Funcdata::opSetInput(data,op,pVVar5,1);
            Funcdata::opInsertBefore(data,op,pFVar2->op);
          }
          else {
            pFVar2->effective_extrapop = iVar3;
            Funcdata::opSetOpcode(data,op,CPUI_INT_ADD);
            pVVar5 = Funcdata::newConstant(data,s,(long)(pFVar2->super_FuncProto).extrapop);
            Funcdata::opSetInput(data,op,pVVar5,1);
            Funcdata::opInsertAfter(data,op,pFVar2->op);
          }
        }
        lVar7 = lVar7 + 1;
        ppFVar6 = (data->qlst).super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (lVar7 < (int)((ulong)((long)(data->qlst).
                                           super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppFVar6) >> 3));
    }
  }
  return 0;
}

Assistant:

int4 ActionExtraPopSetup::apply(Funcdata &data)

{
  FuncCallSpecs *fc;
  PcodeOp *op;

  if (stackspace == (AddrSpace *)0) return 0; // No stack to speak of
  const VarnodeData &point(stackspace->getSpacebase(0));
  Address sb_addr(point.space,point.offset);
  int4 sb_size = point.size;
  
  for(int4 i=0;i<data.numCalls();++i) {
    fc = data.getCallSpecs(i);
    if (fc->getExtraPop() == 0) continue; // Stack pointer is undisturbed
    op = data.newOp(2,fc->getOp()->getAddr());
    data.newVarnodeOut(sb_size,sb_addr,op);
    data.opSetInput(op,data.newVarnode(sb_size,sb_addr),0);
    if (fc->getExtraPop() != ProtoModel::extrapop_unknown) { // We know exactly how stack pointer is changed
      fc->setEffectiveExtraPop(fc->getExtraPop());
      data.opSetOpcode(op,CPUI_INT_ADD);
      data.opSetInput(op,data.newConstant(sb_size,fc->getExtraPop()),1);
      data.opInsertAfter(op,fc->getOp());
    }
    else {			// We don't know exactly, so we create INDIRECT
      data.opSetOpcode(op,CPUI_INDIRECT);
      data.opSetInput(op,data.newVarnodeIop(fc->getOp()),1);
      data.opInsertBefore(op,fc->getOp());
    }
  }
  return 0;
}